

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.h
# Opt level: O0

void __thiscall JPG::~JPG(JPG *this)

{
  ostream *poVar1;
  JPG *this_local;
  
  if (this->data != (MCU *)0x0) {
    if (this->data != (MCU *)0x0) {
      operator_delete__(this->data);
    }
    this->data = (MCU *)0x0;
    poVar1 = std::operator<<((ostream *)&std::cout,"Delete JPG::Data");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (this->blocks != (Block *)0x0) {
    if (this->blocks != (Block *)0x0) {
      operator_delete__(this->blocks);
    }
    this->blocks = (Block *)0x0;
    poVar1 = std::operator<<((ostream *)&std::cout,"Delete JPG:blocks");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (this->BMPData != (YCbCr *)0x0) {
    if (this->BMPData != (YCbCr *)0x0) {
      operator_delete__(this->BMPData);
    }
    this->BMPData = (YCbCr *)0x0;
    poVar1 = std::operator<<((ostream *)&std::cout,"Delete JPG:BMPData");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->huffmanData);
  HuffmanTable::~HuffmanTable(&this->chromaAC);
  HuffmanTable::~HuffmanTable(&this->chromaDC);
  HuffmanTable::~HuffmanTable(&this->yAC);
  HuffmanTable::~HuffmanTable(&this->yDC);
  return;
}

Assistant:

~JPG() {
        if(data) {
            delete[] data;
            data = nullptr;
            std::cout << "Delete JPG::Data" << std::endl;
        }
        if(blocks) {
            delete[] blocks;
            blocks = nullptr;
            std::cout << "Delete JPG:blocks" << std::endl;
        }
        if(BMPData) {
            delete[] BMPData;
            BMPData = nullptr;
            std::cout << "Delete JPG:BMPData" << std::endl;
        }
    }